

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O2

void find_cliques(void)

{
  pointer piVar1;
  uint uVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  int j;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar11;
  int local_104;
  ulong local_100;
  set<int,_std::less<int>,_std::allocator<int>_> P;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  freopen("cliques.txt","w",_stdout);
  P._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &P._M_t._M_impl.super__Rb_tree_header._M_header;
  P._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  P._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  P._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  P._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       P._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_104 = 0; local_104 < V; local_104 = local_104 + 1) {
    pVar11 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
             _M_insert_unique<int_const&>
                       ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        &P,&local_104);
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_104].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,edge.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_104].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,pVar11._8_8_);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60,&P._M_t);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl._0_8_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  bron_kerbosch((set<int,_std::less<int>,_std::allocator<int>_> *)&local_98,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                (set<int,_std::less<int>,_std::allocator<int>_> *)&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_98);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>>
            ((anonymous_namespace)::cliques,DAT_0011f210,
             (_Iter_comp_iter<bool_(*)(const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&)>
              )0x10f29f);
  poVar3 = std::operator<<((ostream *)&std::cout,"Distribution:");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar9 = ((long)DAT_0011f210._M_current - (long)(anonymous_namespace)::cliques._M_current) / 0x18 &
          0xffffffff;
  uVar8 = 0;
  iVar6 = 0;
  pvVar5 = (anonymous_namespace)::cliques._M_current;
  while( true ) {
    uVar9 = uVar9 - 1;
    iVar7 = (int)uVar8;
    if ((int)(uint)uVar9 < 0) break;
    uVar2 = (uint)uVar9 & 0x7fffffff;
    if ((ulong)(long)iVar7 <
        (ulong)((long)pvVar5[uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)pvVar5[uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      if (0 < iVar6) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
        poVar3 = std::operator<<(poVar3,": ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
        pvVar5 = (anonymous_namespace)::cliques._M_current;
      }
      uVar8 = (ulong)((long)pvVar5[uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)pvVar5[uVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar6 = 0;
    }
    iVar6 = iVar6 + 1;
  }
  if (0 < iVar6) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Cliques:");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar8 = 0;
  while (uVar8 < (ulong)(((long)DAT_0011f210._M_current -
                         (long)(anonymous_namespace)::cliques._M_current) / 0x18)) {
    local_100 = uVar8 + 1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_100);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"): ");
    lVar10 = 0;
    for (uVar9 = 0;
        piVar1 = (anonymous_namespace)::cliques._M_current[uVar8].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar9 < (ulong)((long)(anonymous_namespace)::cliques._M_current[uVar8].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar9 = uVar9 + 1) {
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,(key_type *)((long)piVar1 + lVar10));
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
      std::operator<<(poVar3,". ");
      lVar10 = lVar10 + 4;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar8 = local_100;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&P._M_t);
  return;
}

Assistant:

void find_cliques() {
    freopen("cliques.txt", "w", stdout); // output file

    set <int> P;
    for (int i = 0; i < V; i++) {
        P.insert(i);
        stable_sort(edge[i].begin(), edge[i].end());
    }
    
    bron_kerbosch(set<int>(), P, set<int>());

    stable_sort(cliques.begin(), cliques.end(), compare_vectors_by_size);

    cout << "Distribution:" << endl;
    int max_size = 0;
    int max_counter = 0;
    for (int i = cliques.size()-1; i >= 0 ; i--) {
        if (cliques[i].size() > max_size) {
            if (max_counter > 0) {
                cout << max_size << ": " << max_counter << endl;
            }
            max_size = cliques[i].size();
            max_counter = 0;
        }

        max_counter++;
    }
    if (max_counter > 0) {
        cout << max_size << ": " << max_counter << endl;
    }

    cout << "Cliques:" << endl;
    for (int i = 0; i < cliques.size(); i++) {
        cout << i + 1 << "(" << cliques[i].size() << "): ";
        for (int j = 0; j < cliques[i].size(); j++) {
            cout << name[cliques[i][j]] << ". ";
        }
        cout << endl;
    }
}